

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O3

RegEx * YAML::Exp::EndScalar(void)

{
  int iVar1;
  RegEx *ex1;
  RegEx RStack_68;
  RegEx local_48;
  RegEx local_28;
  
  if (EndScalar()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&EndScalar()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(&local_28,':');
      ex1 = BlankOrBreak();
      RegEx::RegEx(&RStack_68);
      operator|(&local_48,ex1,&RStack_68);
      operator+(&EndScalar::e,&local_28,&local_48);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_48.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&RStack_68.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_28.m_params);
      __cxa_atexit(RegEx::~RegEx,&EndScalar::e,&__dso_handle);
      __cxa_guard_release(&EndScalar()::e);
    }
  }
  return &EndScalar::e;
}

Assistant:

inline const RegEx& EndScalar() {
  static const RegEx e = RegEx(':') + (BlankOrBreak() | RegEx());
  return e;
}